

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Transform * __thiscall SceneParser::parseTransform(SceneParser *this)

{
  float sy;
  int iVar1;
  float *pfVar2;
  Transform *this_00;
  float fVar3;
  Matrix4f local_4fc;
  float local_4bc;
  int local_4b8;
  float v;
  int i;
  int j;
  Matrix4f matrix2;
  Matrix4f local_430;
  float local_3f0;
  float local_3ec;
  float radians;
  float degrees;
  Vector3f axis;
  Matrix4f local_39c;
  Matrix4f local_35c;
  Matrix4f local_31c;
  Matrix4f local_2dc;
  Matrix4f local_29c;
  undefined1 local_25c [76];
  Matrix4f local_210;
  Matrix4f local_1d0;
  Matrix4f local_190;
  float local_150;
  float s_1;
  Matrix4f local_10c;
  undefined1 local_cc [8];
  Vector3f s;
  Object3D *object;
  Matrix4f matrix;
  char token [100];
  SceneParser *this_local;
  
  Matrix4f::identity();
  s.m_elements[1] = 0.0;
  s.m_elements[2] = 0.0;
  getToken(this,(char *)(matrix.m_elements + 0xe));
  iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1b7,"Transform *SceneParser::parseTransform()");
  }
  getToken(this,(char *)(matrix.m_elements + 0xe));
  do {
    iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"Scale");
    if (iVar1 == 0) {
      readVector3f((SceneParser *)local_cc);
      pfVar2 = Vector3f::operator[]((Vector3f *)local_cc,0);
      fVar3 = *pfVar2;
      pfVar2 = Vector3f::operator[]((Vector3f *)local_cc,1);
      sy = *pfVar2;
      pfVar2 = Vector3f::operator[]((Vector3f *)local_cc,2);
      Matrix4f::scaling((Matrix4f *)&stack0xfffffffffffffeb4,fVar3,sy,*pfVar2);
      ::operator*(&local_10c,(Matrix4f *)&object,(Matrix4f *)&stack0xfffffffffffffeb4);
      Matrix4f::operator=((Matrix4f *)&object,&local_10c);
    }
    else {
      iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"UniformScale");
      if (iVar1 == 0) {
        local_150 = readFloat(this);
        Matrix4f::uniformScaling(&local_1d0,local_150);
        ::operator*(&local_190,(Matrix4f *)&object,&local_1d0);
        Matrix4f::operator=((Matrix4f *)&object,&local_190);
      }
      else {
        iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"Translate");
        if (iVar1 == 0) {
          readVector3f((SceneParser *)local_25c);
          Matrix4f::translation((Matrix4f *)(local_25c + 0xc),(Vector3f *)local_25c);
          ::operator*(&local_210,(Matrix4f *)&object,(Matrix4f *)(local_25c + 0xc));
          Matrix4f::operator=((Matrix4f *)&object,&local_210);
        }
        else {
          iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"XRotate");
          if (iVar1 == 0) {
            fVar3 = readFloat(this);
            Matrix4f::rotateX(&local_2dc,(fVar3 * 3.1415927) / 180.0);
            ::operator*(&local_29c,(Matrix4f *)&object,&local_2dc);
            Matrix4f::operator=((Matrix4f *)&object,&local_29c);
          }
          else {
            iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"YRotate");
            if (iVar1 == 0) {
              fVar3 = readFloat(this);
              Matrix4f::rotateY(&local_35c,(fVar3 * 3.1415927) / 180.0);
              ::operator*(&local_31c,(Matrix4f *)&object,&local_35c);
              Matrix4f::operator=((Matrix4f *)&object,&local_31c);
            }
            else {
              iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"ZRotate");
              if (iVar1 == 0) {
                fVar3 = readFloat(this);
                Matrix4f::rotateZ((Matrix4f *)(axis.m_elements + 1),(fVar3 * 3.1415927) / 180.0);
                ::operator*(&local_39c,(Matrix4f *)&object,(Matrix4f *)(axis.m_elements + 1));
                Matrix4f::operator=((Matrix4f *)&object,&local_39c);
              }
              else {
                iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"Rotate");
                if (iVar1 == 0) {
                  getToken(this,(char *)(matrix.m_elements + 0xe));
                  iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"{");
                  if (iVar1 != 0) {
                    __assert_fail("!strcmp(token, \"{\")",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                                  ,0x1ce,"Transform *SceneParser::parseTransform()");
                  }
                  readVector3f((SceneParser *)&radians);
                  local_3ec = readFloat(this);
                  local_3f0 = (local_3ec * 3.1415927) / 180.0;
                  Matrix4f::rotation((Matrix4f *)(matrix2.m_elements + 0xe),(Vector3f *)&radians,
                                     local_3f0);
                  ::operator*(&local_430,(Matrix4f *)&object,(Matrix4f *)(matrix2.m_elements + 0xe))
                  ;
                  Matrix4f::operator=((Matrix4f *)&object,&local_430);
                  getToken(this,(char *)(matrix.m_elements + 0xe));
                  iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"}");
                  if (iVar1 != 0) {
                    __assert_fail("!strcmp(token, \"}\")",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                                  ,0x1d4,"Transform *SceneParser::parseTransform()");
                  }
                }
                else {
                  iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"Matrix4f");
                  if (iVar1 != 0) {
                    s.m_elements._4_8_ = parseObject(this,(char *)(matrix.m_elements + 0xe));
                    if ((Object3D *)s.m_elements._4_8_ == (Object3D *)0x0) {
                      __assert_fail("object != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                                    ,0x1eb,"Transform *SceneParser::parseTransform()");
                    }
                    getToken(this,(char *)(matrix.m_elements + 0xe));
                    iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"}");
                    if (iVar1 == 0) {
                      this_00 = (Transform *)operator_new(0xb8);
                      Transform::Transform
                                (this_00,(Matrix4f *)&object,(Object3D *)s.m_elements._4_8_);
                      return this_00;
                    }
                    __assert_fail("!strcmp(token, \"}\")",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                                  ,0x1ed,"Transform *SceneParser::parseTransform()");
                  }
                  Matrix4f::identity();
                  getToken(this,(char *)(matrix.m_elements + 0xe));
                  iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"{");
                  if (iVar1 != 0) {
                    __assert_fail("!strcmp(token, \"{\")",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                                  ,0x1d8,"Transform *SceneParser::parseTransform()");
                  }
                  for (v = 0.0; (int)v < 4; v = (float)((int)v + 1)) {
                    for (local_4b8 = 0; local_4b8 < 4; local_4b8 = local_4b8 + 1) {
                      fVar3 = readFloat(this);
                      local_4bc = fVar3;
                      pfVar2 = Matrix4f::operator()((Matrix4f *)&i,local_4b8,(int)v);
                      *pfVar2 = fVar3;
                    }
                  }
                  getToken(this,(char *)(matrix.m_elements + 0xe));
                  iVar1 = strcmp((char *)(matrix.m_elements + 0xe),"}");
                  if (iVar1 != 0) {
                    __assert_fail("!strcmp(token, \"}\")",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                                  ,0x1e0,"Transform *SceneParser::parseTransform()");
                  }
                  ::operator*(&local_4fc,(Matrix4f *)&i,(Matrix4f *)&object);
                  Matrix4f::operator=((Matrix4f *)&object,&local_4fc);
                }
              }
            }
          }
        }
      }
    }
    getToken(this,(char *)(matrix.m_elements + 0xe));
  } while( true );
}

Assistant:

Transform *
SceneParser::parseTransform() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    Matrix4f matrix = Matrix4f::identity();
    Object3D *object = NULL;
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in transformations:
    // apply to the LEFT side of the current matrix (so the first
    // transform in the list is the last applied to the object).
    getToken(token);
    while (true) {
        if (!strcmp(token, "Scale")) {
            Vector3f s = readVector3f();
            matrix = matrix * Matrix4f::scaling(s[0], s[1], s[2]);
        } else if (!strcmp(token, "UniformScale")) {
            float s = readFloat();
            matrix = matrix * Matrix4f::uniformScaling(s);
        } else if (!strcmp(token, "Translate")) {
            matrix = matrix * Matrix4f::translation(readVector3f());
        } else if (!strcmp(token, "XRotate")) {
            matrix = matrix * Matrix4f::rotateX((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "YRotate")) {
            matrix = matrix * Matrix4f::rotateY((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "ZRotate")) {
            matrix = matrix * Matrix4f::rotateZ((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "Rotate")) {
            getToken(token);
            assert(!strcmp(token, "{"));
            Vector3f axis = readVector3f();
            float degrees = readFloat();
            float radians = (float) DegreesToRadians(degrees);
            matrix = matrix * Matrix4f::rotation(axis, radians);
            getToken(token);
            assert(!strcmp(token, "}"));
        } else if (!strcmp(token, "Matrix4f")) {
            Matrix4f matrix2 = Matrix4f::identity();
            getToken(token);
            assert(!strcmp(token, "{"));
            for (int j = 0; j < 4; j++) {
                for (int i = 0; i < 4; i++) {
                    float v = readFloat();
                    matrix2(i, j) = v;
                }
            }
            getToken(token);
            assert(!strcmp(token, "}"));
            matrix = matrix2 * matrix;
        } else {
            // Otherwise this must be an object,
            // and there are no more transformations.
            object = parseObject(token);
            break;
        }
        getToken(token);
    }

    assert(object != NULL);
    getToken(token);
    assert(!strcmp(token, "}"));
    return new Transform(matrix, object);
}